

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O2

nbt_list * filter_list(nbt_list *list,nbt_predicate_t predicate,void *aux)

{
  list_head *plVar1;
  list_head *plVar2;
  nbt_list *list_00;
  nbt_node *pnVar3;
  int *piVar4;
  undefined8 *puVar5;
  list_head *plVar6;
  
  if (list == (nbt_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0xe7,
                  "struct nbt_list *filter_list(const struct nbt_list *, nbt_predicate_t, void *)");
  }
  list_00 = (nbt_list *)malloc(0x18);
  if (list_00 == (nbt_list *)0x0) {
    piVar4 = __errno_location();
LAB_00104242:
    *piVar4 = -2;
LAB_00104249:
    nbt_free_list(list_00);
    list_00 = (nbt_list *)0x0;
  }
  else {
    list_00->data = (nbt_node *)0x0;
    plVar6 = &list_00->entry;
    (list_00->entry).blink = plVar6;
    (list_00->entry).flink = plVar6;
    plVar1 = &list->entry;
    while (plVar1 = plVar1->flink, plVar1 != &list->entry) {
      pnVar3 = nbt_filter((nbt_node *)plVar1[-1].flink,predicate,aux);
      piVar4 = __errno_location();
      if (*piVar4 != 0) goto LAB_00104249;
      if (pnVar3 != (nbt_node *)0x0) {
        puVar5 = (undefined8 *)malloc(0x18);
        if (puVar5 == (undefined8 *)0x0) goto LAB_00104242;
        *puVar5 = pnVar3;
        puVar5[2] = plVar6;
        plVar2 = plVar6->blink;
        puVar5[1] = plVar2;
        plVar6->blink = (list_head *)(puVar5 + 1);
        plVar2->flink = (list_head *)(puVar5 + 1);
      }
    }
  }
  return list_00;
}

Assistant:

static struct nbt_list* filter_list(const struct nbt_list* list, nbt_predicate_t predicate, void* aux)
{
    assert(list);

    struct nbt_list* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, goto filter_error);

    ret->data = NULL;
    INIT_LIST_HEAD(&ret->entry);

    const struct list_head* pos;
    list_for_each(pos, &list->entry)
    {
        const struct nbt_list* p = list_entry(pos, struct nbt_list, entry);

        nbt_node* new_node = nbt_filter(p->data, predicate, aux);

        if(errno != NBT_OK)  goto filter_error;
        if(new_node == NULL) continue;

        struct nbt_list* new_entry;
        CHECKED_MALLOC(new_entry, sizeof *new_entry, goto filter_error);

        new_entry->data = new_node;
        list_add_tail(&new_entry->entry, &ret->entry);
    }

    return ret;

filter_error:
    if(errno == NBT_OK)
        errno = NBT_EMEM;

    nbt_free_list(ret);
    return NULL;
}